

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O1

int LaunchMultiCliTCPSrv(char *port,_func_int_SOCKET_void_ptr *handlecli,void *pParam)

{
  SOCKET SVar1;
  int iVar2;
  undefined8 *pParam_00;
  SOCKET sockcli;
  SOCKET socksrv;
  THREAD_IDENTIFIER handlecliThreadId;
  SOCKET local_40;
  SOCKET local_3c;
  pthread_t local_38;
  
  local_3c = -1;
  local_40 = -1;
  iVar2 = inittcpsrv(&local_3c,"0.0.0.0",port,0x1000,10000);
  if (iVar2 == 0) {
    while( true ) {
      do {
        iVar2 = waitforclifortcpsrv(local_3c,&local_40,10000);
        SVar1 = local_3c;
      } while (iVar2 == 2);
      if (iVar2 != 0) break;
      pParam_00 = (undefined8 *)calloc(1,0x18);
      if (pParam_00 == (undefined8 *)0x0) {
LAB_0010fd39:
        SVar1 = local_40;
        shutdown(local_40,2);
        close(SVar1);
      }
      else {
        *pParam_00 = handlecli;
        *(SOCKET *)(pParam_00 + 1) = local_40;
        pParam_00[2] = pParam;
        iVar2 = CreateDefaultThread(handlecliThreadProc,pParam_00,&local_38);
        if (iVar2 != 0) {
          free(pParam_00);
          goto LAB_0010fd39;
        }
        pthread_detach(local_38);
      }
    }
    shutdown(local_3c,2);
    close(SVar1);
  }
  return 1;
}

Assistant:

inline int LaunchMultiCliTCPSrv(char* port, int (*handlecli)(SOCKET, void*), void* pParam)
{
	int iResult = EXIT_FAILURE;
	SOCKET socksrv = INVALID_SOCKET;
	SOCKET sockcli = INVALID_SOCKET;
	THREAD_IDENTIFIER handlecliThreadId;
	HANDLECLITHREADPARAM* pHandlecliThreadParam = NULL;

	if (inittcpsrv(&socksrv, "0.0.0.0", port, SOMAXCONN, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	for (;;)
	{
		iResult = waitforclifortcpsrv(socksrv, &sockcli, DEFAULT_SOCK_TIMEOUT);
		switch (iResult)
		{
		case EXIT_SUCCESS:		
			pHandlecliThreadParam = (HANDLECLITHREADPARAM*)calloc(1, sizeof(HANDLECLITHREADPARAM));
			if (!pHandlecliThreadParam)	
			{
				PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
					strtime_m(), 
					"Unable to handle new client. "));
				if (disconnectclifromtcpsrv(sockcli) != EXIT_SUCCESS)
				{
					PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
						strtime_m(), 
						"Error disconnecting a client. "));
				}
				break;
			}
			pHandlecliThreadParam->handlecli = handlecli;
			pHandlecliThreadParam->sockcli = sockcli;
			pHandlecliThreadParam->pParam = pParam;
			if (CreateDefaultThread(handlecliThreadProc, pHandlecliThreadParam, &handlecliThreadId) != EXIT_SUCCESS)
			{
				PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
					strtime_m(), 
					"Unable to handle new client. "));
				free(pHandlecliThreadParam);
				if (disconnectclifromtcpsrv(sockcli) != EXIT_SUCCESS)
				{
					PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
						strtime_m(), 
						"Error disconnecting a client. "));
				}
				break;
			}
			if (DetachThread(handlecliThreadId) != EXIT_SUCCESS)
			{
				PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
					strtime_m(), 
					"Error processing new client. "));
			}
			break;
		case EXIT_TIMEOUT:
			break;
		default:
			releasetcpsrv(socksrv);
			return EXIT_FAILURE;
		}
	}

	if (releasetcpsrv(socksrv) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}